

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::ConfidentialTransaction
          (ConfidentialTransaction *this,ConfidentialTransaction *transaction)

{
  string local_38;
  ConfidentialTransaction *local_18;
  ConfidentialTransaction *transaction_local;
  ConfidentialTransaction *this_local;
  
  local_18 = transaction;
  transaction_local = this;
  AbstractTransaction::GetHex_abi_cxx11_(&local_38,&transaction->super_AbstractTransaction);
  ConfidentialTransaction(this,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

ConfidentialTransaction::ConfidentialTransaction(
    const ConfidentialTransaction &transaction)
    : ConfidentialTransaction(transaction.GetHex()) {
  // copy constructor
}